

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

bool __thiscall
math::wide_integer::uintwide_t<64u,unsigned_char,void,true>::wr_string<char*>
          (uintwide_t<64u,unsigned_char,void,true> *this,char *str_result,uint_fast8_t base_rep,
          bool show_base,bool show_pos,bool is_uppercase,unsigned_fast_type field_width,
          char fill_char_str)

{
  char cVar1;
  unsigned_fast_type uVar2;
  uintwide_t<64U,_unsigned_char,_void,_true> uVar3;
  bool bVar4;
  uchar uVar5;
  size_type_conflict sVar6;
  byte *pbVar7;
  reference pcVar8;
  size_type sVar9;
  pointer pcVar10;
  uintwide_t<64U,_unsigned_char,_void,_true> *v;
  reference pcVar11;
  pointer pcVar12;
  reference pcVar13;
  pointer pcVar14;
  char local_141;
  unsigned_long local_e8;
  unsigned_fast_type local_e0;
  unsigned_fast_type dst;
  signed_fast_type pos_2;
  string_storage_hex_type str_temp_2;
  uintwide_t<64U,_unsigned_char,_void,_false> t_2;
  array<unsigned_char,_8UL> local_a8;
  representation_type local_a0;
  array<unsigned_char,_8UL> local_98;
  uintwide_t<64U,_unsigned_char,_void,_true> tmp;
  signed_fast_type pos_1;
  string_storage_dec_type str_temp_1;
  bool str_has_neg_sign;
  uintwide_t<64U,_unsigned_char,_void,_true> t_1;
  byte local_51;
  ulong uStack_50;
  char c;
  signed_fast_type pos;
  string_storage_oct_type str_temp;
  limb_type_conflict1 mask;
  uintwide_t<64U,_unsigned_char,_void,_false> t;
  bool wr_string_is_ok;
  bool is_uppercase_local;
  bool show_pos_local;
  bool show_base_local;
  uint_fast8_t base_rep_local;
  char *str_result_local;
  uintwide_t<64U,_unsigned_char,_void,_true> *this_local;
  
  t.values.super_array<unsigned_char,_8UL>.elems[0] = '\x01';
  if (base_rep == '\b') {
    uintwide_t<64U,_unsigned_char,_void,_false>::uintwide_t<true,_nullptr>
              ((uintwide_t<64U,_unsigned_char,_void,_false> *)
               (str_temp.super_array<char,_30UL>.elems + 0x17),
               (uintwide_t<64U,_unsigned_char,_void,_true> *)this);
    str_temp.super_array<char,_30UL>.elems[0x16] = '\a';
    memset((void *)((long)&pos + 4),0,0x1e);
    detail::fixed_static_array<char,_30U>::fixed_static_array
              ((fixed_static_array<char,_30U> *)((long)&pos + 4));
    sVar6 = detail::fixed_static_array<char,_30U>::static_size();
    uStack_50 = (ulong)(sVar6 - 1);
    bVar4 = uintwide_t<64U,_unsigned_char,_void,_false>::is_zero
                      ((uintwide_t<64U,_unsigned_char,_void,_false> *)
                       (str_temp.super_array<char,_30UL>.elems + 0x17));
    if (bVar4) {
      uStack_50 = uStack_50 - 1;
      pcVar8 = detail::fixed_static_array<char,_30U>::operator[]
                         ((fixed_static_array<char,_30U> *)((long)&pos + 4),
                          (size_type_conflict)uStack_50);
      *pcVar8 = '0';
    }
    else {
      while (bVar4 = uintwide_t<64U,_unsigned_char,_void,_false>::is_zero
                               ((uintwide_t<64U,_unsigned_char,_void,_false> *)
                                (str_temp.super_array<char,_30UL>.elems + 0x17)),
            !bVar4 && 0 < (long)uStack_50) {
        pbVar7 = detail::array_detail::array<unsigned_char,_8UL>::cbegin
                           ((array<unsigned_char,_8UL> *)
                            (str_temp.super_array<char,_30UL>.elems + 0x17));
        local_51 = *pbVar7 & 7;
        if (local_51 < 9) {
          local_51 = local_51 + 0x30;
        }
        uStack_50 = uStack_50 - 1;
        pbVar7 = (byte *)detail::fixed_static_array<char,_30U>::operator[]
                                   ((fixed_static_array<char,_30U> *)((long)&pos + 4),
                                    (size_type_conflict)uStack_50);
        *pbVar7 = local_51;
        uintwide_t<64u,unsigned_char,void,false>::operator>>=
                  ((uintwide_t<64u,unsigned_char,void,false> *)
                   (str_temp.super_array<char,_30UL>.elems + 0x17),3);
      }
    }
    if ((show_base) && (0 < (long)uStack_50)) {
      uStack_50 = uStack_50 - 1;
      pcVar8 = detail::fixed_static_array<char,_30U>::operator[]
                         ((fixed_static_array<char,_30U> *)((long)&pos + 4),
                          (size_type_conflict)uStack_50);
      *pcVar8 = '0';
    }
    if ((show_pos) && (0 < (long)uStack_50)) {
      uStack_50 = uStack_50 - 1;
      pcVar8 = detail::fixed_static_array<char,_30U>::operator[]
                         ((fixed_static_array<char,_30U> *)((long)&pos + 4),
                          (size_type_conflict)uStack_50);
      *pcVar8 = '+';
    }
    if (field_width != 0) {
      sVar9 = detail::array_detail::array<char,_30UL>::size();
      t_1.values.super_array<unsigned_char,_8UL>.elems = (representation_type)(sVar9 - 1);
      field_width = detail::min_unsafe<unsigned_long>(&field_width,(unsigned_long *)&t_1);
      while (sVar9 = detail::array_detail::array<char,_30UL>::size(), cVar1 = fill_char_str,
            (long)((sVar9 - 1) - field_width) < (long)uStack_50) {
        uStack_50 = uStack_50 - 1;
        pcVar8 = detail::fixed_static_array<char,_30U>::operator[]
                           ((fixed_static_array<char,_30U> *)((long)&pos + 4),
                            (size_type_conflict)uStack_50);
        *pcVar8 = cVar1;
      }
    }
    sVar9 = detail::array_detail::array<char,_30UL>::size();
    pcVar8 = detail::fixed_static_array<char,_30U>::operator[]
                       ((fixed_static_array<char,_30U> *)((long)&pos + 4),(int)sVar9 - 1);
    *pcVar8 = '\0';
    pcVar10 = detail::array_detail::array<char,_30UL>::data((array<char,_30UL> *)((long)&pos + 4));
    detail::strcpy_unsafe<char*,char*>(str_result,pcVar10 + uStack_50);
  }
  else if (base_rep == '\n') {
    unique0x00012000 = *(value_type_conflict4 (*) [8])this;
    str_temp_1.super_array<char,_29UL>.elems[0x15] =
         uintwide_t<64U,_unsigned_char,_void,_true>::is_neg<true>
                   ((uintwide_t<64U,_unsigned_char,_void,_true> *)
                    (str_temp_1.super_array<char,_29UL>.elems + 0x16),(enable_if_t<true,_int> *)0x0)
    ;
    if ((bool)str_temp_1.super_array<char,_29UL>.elems[0x15]) {
      uintwide_t<64U,_unsigned_char,_void,_true>::negate
                ((uintwide_t<64U,_unsigned_char,_void,_true> *)
                 (str_temp_1.super_array<char,_29UL>.elems + 0x16));
    }
    memset((void *)((long)&pos_1 + 2),0,0x1d);
    detail::fixed_static_array<char,_29U>::fixed_static_array
              ((fixed_static_array<char,_29U> *)((long)&pos_1 + 2));
    sVar6 = detail::fixed_static_array<char,_29U>::static_size();
    tmp.values.super_array<unsigned_char,_8UL>.elems._0_4_ = sVar6 - 1;
    tmp.values.super_array<unsigned_char,_8UL>.elems[4] = '\0';
    tmp.values.super_array<unsigned_char,_8UL>.elems[5] = '\0';
    tmp.values.super_array<unsigned_char,_8UL>.elems[6] = '\0';
    tmp.values.super_array<unsigned_char,_8UL>.elems[7] = '\0';
    bVar4 = uintwide_t<64U,_unsigned_char,_void,_true>::is_zero
                      ((uintwide_t<64U,_unsigned_char,_void,_true> *)
                       (str_temp_1.super_array<char,_29UL>.elems + 0x16));
    if (bVar4) {
      tmp.values.super_array<unsigned_char,_8UL>.elems =
           (representation_type)((long)tmp.values.super_array<unsigned_char,_8UL>.elems + -1);
      pcVar11 = detail::fixed_static_array<char,_29U>::operator[]
                          ((fixed_static_array<char,_29U> *)((long)&pos_1 + 2),
                           tmp.values.super_array<unsigned_char,_8UL>.elems._0_4_);
      *pcVar11 = '0';
    }
    else {
      while (bVar4 = uintwide_t<64U,_unsigned_char,_void,_true>::is_zero
                               ((uintwide_t<64U,_unsigned_char,_void,_true> *)
                                (str_temp_1.super_array<char,_29UL>.elems + 0x16)),
            !bVar4 && 0 < (long)tmp.values.super_array<unsigned_char,_8UL>.elems) {
        local_98.elems[0] = str_temp_1.super_array<char,_29UL>.elems[0x16];
        local_98.elems[1] = str_temp_1.super_array<char,_29UL>.elems[0x17];
        local_98.elems[2] = str_temp_1.super_array<char,_29UL>.elems[0x18];
        local_98.elems[3] = str_temp_1.super_array<char,_29UL>.elems[0x19];
        local_98.elems[4] = str_temp_1.super_array<char,_29UL>.elems[0x1a];
        local_98.elems[5] = str_temp_1.super_array<char,_29UL>.elems[0x1b];
        local_98.elems[6] = str_temp_1.super_array<char,_29UL>.elems[0x1c];
        local_98.elems[7] = str_has_neg_sign;
        uintwide_t<64U,_unsigned_char,_void,_true>::eval_divide_by_single_limb
                  ((uintwide_t<64U,_unsigned_char,_void,_true> *)
                   (str_temp_1.super_array<char,_29UL>.elems + 0x16),'\n',0,
                   (uintwide_t<64U,_unsigned_char,_void,_true> *)0x0);
        local_a8.elems[0] = str_temp_1.super_array<char,_29UL>.elems[0x16];
        local_a8.elems[1] = str_temp_1.super_array<char,_29UL>.elems[0x17];
        local_a8.elems[2] = str_temp_1.super_array<char,_29UL>.elems[0x18];
        local_a8.elems[3] = str_temp_1.super_array<char,_29UL>.elems[0x19];
        local_a8.elems[4] = str_temp_1.super_array<char,_29UL>.elems[0x1a];
        local_a8.elems[5] = str_temp_1.super_array<char,_29UL>.elems[0x1b];
        local_a8.elems[6] = str_temp_1.super_array<char,_29UL>.elems[0x1c];
        local_a8.elems[7] = str_has_neg_sign;
        v = uintwide_t<64U,_unsigned_char,_void,_true>::mul_by_limb
                      ((uintwide_t<64U,_unsigned_char,_void,_true> *)&local_a8,'\n');
        local_a0.super_array<unsigned_char,_8UL>.elems =
             (array<unsigned_char,_8UL>)
             wide_integer::operator-((uintwide_t<64U,_unsigned_char,_void,_true> *)&local_98,v);
        uVar5 = wide_integer::uintwide_t::operator_cast_to_unsigned_char((uintwide_t *)&local_a0);
        tmp.values.super_array<unsigned_char,_8UL>.elems =
             (representation_type)((long)tmp.values.super_array<unsigned_char,_8UL>.elems + -1);
        pcVar11 = detail::fixed_static_array<char,_29U>::operator[]
                            ((fixed_static_array<char,_29U> *)((long)&pos_1 + 2),
                             tmp.values.super_array<unsigned_char,_8UL>.elems._0_4_);
        *pcVar11 = uVar5 + '0';
      }
    }
    if (0 < (long)tmp.values.super_array<unsigned_char,_8UL>.elems) {
      if ((show_pos) && ((str_temp_1.super_array<char,_29UL>.elems[0x15] & 1U) == 0)) {
        tmp.values.super_array<unsigned_char,_8UL>.elems =
             (representation_type)((long)tmp.values.super_array<unsigned_char,_8UL>.elems + -1);
        pcVar11 = detail::fixed_static_array<char,_29U>::operator[]
                            ((fixed_static_array<char,_29U> *)((long)&pos_1 + 2),
                             tmp.values.super_array<unsigned_char,_8UL>.elems._0_4_);
        *pcVar11 = '+';
      }
      else if ((str_temp_1.super_array<char,_29UL>.elems[0x15] & 1U) != 0) {
        tmp.values.super_array<unsigned_char,_8UL>.elems =
             (representation_type)((long)tmp.values.super_array<unsigned_char,_8UL>.elems + -1);
        pcVar11 = detail::fixed_static_array<char,_29U>::operator[]
                            ((fixed_static_array<char,_29U> *)((long)&pos_1 + 2),
                             tmp.values.super_array<unsigned_char,_8UL>.elems._0_4_);
        *pcVar11 = '-';
      }
    }
    if (field_width != 0) {
      sVar9 = detail::array_detail::array<char,_29UL>::size();
      t_2.values.super_array<unsigned_char,_8UL>.elems = (representation_type)(sVar9 - 1);
      field_width = detail::min_unsafe<unsigned_long>(&field_width,(unsigned_long *)&t_2);
      while (uVar3.values.super_array<unsigned_char,_8UL>.elems =
                  tmp.values.super_array<unsigned_char,_8UL>.elems,
            sVar9 = detail::array_detail::array<char,_29UL>::size(), cVar1 = fill_char_str,
            (long)((sVar9 - 1) - field_width) <
            (long)uVar3.values.super_array<unsigned_char,_8UL>.elems) {
        tmp.values.super_array<unsigned_char,_8UL>.elems =
             (representation_type)((long)tmp.values.super_array<unsigned_char,_8UL>.elems + -1);
        pcVar11 = detail::fixed_static_array<char,_29U>::operator[]
                            ((fixed_static_array<char,_29U> *)((long)&pos_1 + 2),
                             tmp.values.super_array<unsigned_char,_8UL>.elems._0_4_);
        *pcVar11 = cVar1;
      }
    }
    sVar9 = detail::array_detail::array<char,_29UL>::size();
    pcVar11 = detail::fixed_static_array<char,_29U>::operator[]
                        ((fixed_static_array<char,_29U> *)((long)&pos_1 + 2),(int)sVar9 - 1);
    *pcVar11 = '\0';
    pcVar12 = detail::array_detail::array<char,_29UL>::data((array<char,_29UL> *)((long)&pos_1 + 2))
    ;
    detail::strcpy_unsafe<char*,char*>
              (str_result,pcVar12 + (long)tmp.values.super_array<unsigned_char,_8UL>.elems);
  }
  else if (base_rep == '\x10') {
    uintwide_t<64U,_unsigned_char,_void,_false>::uintwide_t<true,_nullptr>
              ((uintwide_t<64U,_unsigned_char,_void,_false> *)
               (str_temp_2.super_array<char,_24UL>.elems + 0x10),
               (uintwide_t<64U,_unsigned_char,_void,_true> *)this);
    memset(&pos_2,0,0x18);
    detail::fixed_static_array<char,_24U>::fixed_static_array
              ((fixed_static_array<char,_24U> *)&pos_2);
    sVar6 = detail::fixed_static_array<char,_24U>::static_size();
    dst = (unsigned_fast_type)(sVar6 - 1);
    bVar4 = uintwide_t<64U,_unsigned_char,_void,_false>::is_zero
                      ((uintwide_t<64U,_unsigned_char,_void,_false> *)
                       (str_temp_2.super_array<char,_24UL>.elems + 0x10));
    if (bVar4) {
      dst = dst - 1;
      pcVar13 = detail::fixed_static_array<char,_24U>::operator[]
                          ((fixed_static_array<char,_24U> *)&pos_2,(size_type_conflict)dst);
      *pcVar13 = '0';
    }
    else {
      pcVar13 = detail::fixed_static_array<char,_24U>::operator[]
                          ((fixed_static_array<char,_24U> *)&pos_2,(size_type_conflict)dst);
      local_e0 = uintwide_t<64U,_unsigned_char,_void,_true>::extract_hex_digits<false,_nullptr>
                           ((uintwide_t<64U,_unsigned_char,_void,_false> *)
                            (str_temp_2.super_array<char,_24UL>.elems + 0x10),pcVar13,is_uppercase);
      dst = dst - local_e0;
    }
    if ((show_base) && (1 < (long)dst)) {
      local_141 = 'X';
      if (!is_uppercase) {
        local_141 = 'x';
      }
      dst = dst - 1;
      pcVar13 = detail::fixed_static_array<char,_24U>::operator[]
                          ((fixed_static_array<char,_24U> *)&pos_2,(size_type_conflict)dst);
      *pcVar13 = local_141;
      dst = dst - 1;
      pcVar13 = detail::fixed_static_array<char,_24U>::operator[]
                          ((fixed_static_array<char,_24U> *)&pos_2,(size_type_conflict)dst);
      *pcVar13 = '0';
    }
    if ((show_pos) && (0 < (long)dst)) {
      dst = dst - 1;
      pcVar13 = detail::fixed_static_array<char,_24U>::operator[]
                          ((fixed_static_array<char,_24U> *)&pos_2,(size_type_conflict)dst);
      *pcVar13 = '+';
    }
    if (field_width != 0) {
      sVar9 = detail::array_detail::array<char,_24UL>::size();
      local_e8 = sVar9 - 1;
      field_width = detail::min_unsafe<unsigned_long>(&field_width,&local_e8);
      while (uVar2 = dst, sVar9 = detail::array_detail::array<char,_24UL>::size(),
            cVar1 = fill_char_str, (long)((sVar9 - 1) - field_width) < (long)uVar2) {
        dst = dst - 1;
        pcVar13 = detail::fixed_static_array<char,_24U>::operator[]
                            ((fixed_static_array<char,_24U> *)&pos_2,(size_type_conflict)dst);
        *pcVar13 = cVar1;
      }
    }
    sVar9 = detail::array_detail::array<char,_24UL>::size();
    pcVar13 = detail::fixed_static_array<char,_24U>::operator[]
                        ((fixed_static_array<char,_24U> *)&pos_2,(int)sVar9 - 1);
    *pcVar13 = '\0';
    pcVar14 = detail::array_detail::array<char,_24UL>::data((array<char,_24UL> *)&pos_2);
    detail::strcpy_unsafe<char*,char*>(str_result,pcVar14 + dst);
  }
  else {
    t.values.super_array<unsigned_char,_8UL>.elems[0] = '\0';
  }
  return (bool)t.values.super_array<unsigned_char,_8UL>.elems[0];
}

Assistant:

constexpr auto wr_string(      OutputStrIterator  str_result, // NOLINT(readability-function-cognitive-complexity)
                             const std::uint_fast8_t  base_rep      = static_cast<std::uint_fast8_t>(UINT8_C(0x10)),
                             const bool               show_base     = true,
                             const bool               show_pos      = false,
                             const bool               is_uppercase  = true,
                                   unsigned_fast_type field_width   = static_cast<unsigned_fast_type>(UINT8_C(0)),
                             const char               fill_char_str = '0') const -> bool
    {
      auto wr_string_is_ok = true;

      if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        const auto mask = static_cast<limb_type>(static_cast<std::uint8_t>(0x7U));

        using string_storage_oct_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_oct()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_oct(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_oct_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_oct_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_oct_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) })) // NOLINT(altera-id-dependent-backward-branch)
          {
            auto c = static_cast<char>(*t.values.cbegin() & mask);

            if(c <= static_cast<char>(INT8_C(8))) { c = static_cast<char>(c + static_cast<char>(INT8_C(0x30))); }

            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = c;

            t >>= static_cast<unsigned>(UINT8_C(3));
          }
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_oct_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
      {
        uintwide_t t(*this);

        const auto str_has_neg_sign = is_neg(t);

        if(str_has_neg_sign)
        {
          t.negate();
        }

        using string_storage_dec_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_dec()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_dec(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_dec_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_dec_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_dec_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) }))
          {
            const uintwide_t tmp(t);

            t.eval_divide_by_single_limb(static_cast<limb_type>(UINT8_C(10)), 0U, nullptr);

            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] =
              static_cast<char>
              (
                  static_cast<limb_type>
                  (
                    tmp - (uintwide_t(t).mul_by_limb(static_cast<limb_type>(UINT8_C(10))))
                  )
                + static_cast<limb_type>(UINT8_C(0x30))
              );
          }
        }

        if(pos > signed_fast_type { UINT8_C(0) })
        {
          if(show_pos && (!str_has_neg_sign))
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '+';
          }
          else if(str_has_neg_sign)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '-';
          }
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_dec_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        using string_storage_hex_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_hex()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_hex(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_hex_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_hex_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_hex_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }
        else
        {
          const auto dst =
            extract_hex_digits<false>
            (
              t,
              &str_temp[static_cast<typename string_storage_hex_type::size_type>(pos)],
              is_uppercase
            );

          pos -= static_cast<signed_fast_type>(dst);
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(1) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = (is_uppercase ? 'X' : 'x');

          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_hex_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else
      {
        wr_string_is_ok = false;
      }

      return wr_string_is_ok;
    }